

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multisetTest.cpp
# Opt level: O0

void print<ft::multiset<int,ft::less<int>,ft::allocator<int>>>
               (multiset<int,_ft::less<int>,_ft::allocator<int>_> *t,char *s)

{
  bool bVar1;
  ostream *poVar2;
  const_reference pvVar3;
  treeIterator<int,_ft::allocator<ft::treeNode<int>_>_> local_78;
  const_iterator local_60;
  int local_34;
  undefined1 local_30 [8];
  const_iterator it;
  char *s_local;
  multiset<int,_ft::less<int>,_ft::allocator<int>_> *t_local;
  
  it.super_treeIterator<int,_ft::allocator<ft::treeNode<int>_>_>.m_node = (treeNode<int> *)s;
  ft::constTreeIterator<int,_ft::allocator<ft::treeNode<int>_>_>::constTreeIterator
            ((constTreeIterator<int,_ft::allocator<ft::treeNode<int>_>_> *)local_30);
  local_34 = (int)std::setw(3);
  poVar2 = std::operator<<((ostream *)&std::cout,(_Setw)local_34);
  poVar2 = std::operator<<(poVar2,(char *)it.
                                          super_treeIterator<int,_ft::allocator<ft::treeNode<int>_>_>
                                          .m_node);
  std::operator<<(poVar2," contains:");
  ft::treeBase<int,_int,_int,_ft::less<int>,_ft::allocator<int>_>::begin
            (&local_60,(treeBase<int,_int,_int,_ft::less<int>,_ft::allocator<int>_> *)t);
  ft::constTreeIterator<int,_ft::allocator<ft::treeNode<int>_>_>::operator=
            ((constTreeIterator<int,_ft::allocator<ft::treeNode<int>_>_> *)local_30,&local_60);
  ft::constTreeIterator<int,_ft::allocator<ft::treeNode<int>_>_>::~constTreeIterator(&local_60);
  while( true ) {
    ft::treeBase<int,_int,_int,_ft::less<int>,_ft::allocator<int>_>::end
              ((const_iterator *)&local_78,
               (treeBase<int,_int,_int,_ft::less<int>,_ft::allocator<int>_> *)t);
    bVar1 = ft::operator!=((treeIterator<int,_ft::allocator<ft::treeNode<int>_>_> *)local_30,
                           &local_78);
    ft::constTreeIterator<int,_ft::allocator<ft::treeNode<int>_>_>::~constTreeIterator
              ((constTreeIterator<int,_ft::allocator<ft::treeNode<int>_>_> *)&local_78);
    if (!bVar1) break;
    poVar2 = std::operator<<((ostream *)&std::cout,' ');
    pvVar3 = ft::constTreeIterator<int,_ft::allocator<ft::treeNode<int>_>_>::operator*
                       ((constTreeIterator<int,_ft::allocator<ft::treeNode<int>_>_> *)local_30);
    std::ostream::operator<<(poVar2,*pvVar3);
    ft::treeIterator<int,_ft::allocator<ft::treeNode<int>_>_>::operator++
              ((treeIterator<int,_ft::allocator<ft::treeNode<int>_>_> *)local_30);
  }
  std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  ft::constTreeIterator<int,_ft::allocator<ft::treeNode<int>_>_>::~constTreeIterator
            ((constTreeIterator<int,_ft::allocator<ft::treeNode<int>_>_> *)local_30);
  return;
}

Assistant:

void	print(T const & t, char const * s)
{
	typename T::const_iterator	it;

	std::cout << std::setw(3) << s << " contains:";
	for (it = t.begin(); it != t.end(); ++it)
		std::cout << ' ' << *it;
	std::cout << std::endl;
}